

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::sse2::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  byte bVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ulong uVar16;
  RTCFilterFunctionN p_Var17;
  RayHitK<4> *pRVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  Scene *pSVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  uint uVar27;
  float fVar37;
  float fVar39;
  float fVar41;
  undefined1 auVar28 [16];
  uint uVar38;
  uint uVar40;
  uint uVar42;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar43;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  uint uVar78;
  float fVar82;
  float fVar84;
  undefined1 auVar79 [16];
  uint uVar83;
  uint uVar85;
  float fVar86;
  uint uVar87;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 (*local_220) [16];
  RTCFilterFunctionNArguments local_218;
  float local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8 [4];
  float local_1a8 [4];
  float local_198 [4];
  float local_188 [6];
  Scene *local_170;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar21 = context->scene;
  local_d8[0] = sphere->sharedGeomID;
  pGVar6 = (pSVar21->geometries).items[local_d8[0]].ptr;
  lVar19 = *(long *)&pGVar6->field_0x58;
  _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar19 + (sphere->primIDs).field_0.i[0] * _Var7);
  pfVar2 = (float *)(lVar19 + (sphere->primIDs).field_0.i[1] * _Var7);
  pfVar3 = (float *)(lVar19 + (sphere->primIDs).field_0.i[2] * _Var7);
  pfVar4 = (float *)(lVar19 + (sphere->primIDs).field_0.i[3] * _Var7);
  bVar5 = sphere->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar110 = *(float *)(ray + k * 4);
  fVar111 = *(float *)(ray + k * 4 + 0x10);
  fVar113 = *(float *)(ray + k * 4 + 0x20);
  fVar114 = *(float *)(ray + k * 4 + 0x40);
  fVar115 = *(float *)(ray + k * 4 + 0x50);
  fVar116 = *(float *)(ray + k * 4 + 0x60);
  auVar89._0_4_ = fVar114 * fVar114 + fVar115 * fVar115 + fVar116 * fVar116;
  auVar89._4_4_ = auVar89._0_4_;
  auVar89._8_4_ = auVar89._0_4_;
  auVar89._12_4_ = auVar89._0_4_;
  auVar79 = rcpps(ZEXT416((uint)(fVar116 * fVar116)),auVar89);
  fVar61 = auVar79._0_4_;
  fVar71 = auVar79._4_4_;
  fVar72 = auVar79._8_4_;
  fVar73 = auVar79._12_4_;
  fVar61 = (1.0 - auVar89._0_4_ * fVar61) * fVar61 + fVar61;
  fVar71 = (1.0 - auVar89._0_4_ * fVar71) * fVar71 + fVar71;
  fVar72 = (1.0 - auVar89._0_4_ * fVar72) * fVar72 + fVar72;
  fVar73 = (1.0 - auVar89._0_4_ * fVar73) * fVar73 + fVar73;
  fVar95 = ((*pfVar1 - fVar110) * fVar114 +
           (pfVar1[1] - fVar111) * fVar115 + (pfVar1[2] - fVar113) * fVar116) * fVar61;
  fVar96 = ((*pfVar2 - fVar110) * fVar114 +
           (pfVar2[1] - fVar111) * fVar115 + (pfVar2[2] - fVar113) * fVar116) * fVar71;
  fVar97 = ((*pfVar3 - fVar110) * fVar114 +
           (pfVar3[1] - fVar111) * fVar115 + (pfVar3[2] - fVar113) * fVar116) * fVar72;
  fVar98 = ((*pfVar4 - fVar110) * fVar114 +
           (pfVar4[1] - fVar111) * fVar115 + (pfVar4[2] - fVar113) * fVar116) * fVar73;
  fVar106 = (*pfVar1 - fVar110) - fVar114 * fVar95;
  fVar107 = (*pfVar2 - fVar110) - fVar114 * fVar96;
  fVar108 = (*pfVar3 - fVar110) - fVar114 * fVar97;
  fVar109 = (*pfVar4 - fVar110) - fVar114 * fVar98;
  fVar102 = (pfVar1[1] - fVar111) - fVar115 * fVar95;
  fVar103 = (pfVar2[1] - fVar111) - fVar115 * fVar96;
  fVar104 = (pfVar3[1] - fVar111) - fVar115 * fVar97;
  fVar105 = (pfVar4[1] - fVar111) - fVar115 * fVar98;
  fVar110 = (pfVar1[2] - fVar113) - fVar116 * fVar95;
  fVar111 = (pfVar2[2] - fVar113) - fVar116 * fVar96;
  fVar112 = (pfVar3[2] - fVar113) - fVar116 * fVar97;
  fVar113 = (pfVar4[2] - fVar113) - fVar116 * fVar98;
  auVar88._0_4_ = fVar102 * fVar102 + fVar110 * fVar110;
  auVar88._4_4_ = fVar103 * fVar103 + fVar111 * fVar111;
  auVar88._8_4_ = fVar104 * fVar104 + fVar112 * fVar112;
  auVar88._12_4_ = fVar105 * fVar105 + fVar113 * fVar113;
  fVar77 = fVar106 * fVar106 + auVar88._0_4_;
  fVar82 = fVar107 * fVar107 + auVar88._4_4_;
  fVar84 = fVar108 * fVar108 + auVar88._8_4_;
  fVar86 = fVar109 * fVar109 + auVar88._12_4_;
  fVar26 = pfVar1[3] * pfVar1[3];
  fVar37 = pfVar2[3] * pfVar2[3];
  fVar39 = pfVar3[3] * pfVar3[3];
  fVar41 = pfVar4[3] * pfVar4[3];
  bVar11 = bVar5 != 0 && fVar77 <= fVar26;
  auVar79._0_4_ = -(uint)bVar11;
  bVar12 = 1 < bVar5 && fVar82 <= fVar37;
  auVar79._4_4_ = -(uint)bVar12;
  bVar10 = 2 < bVar5 && fVar84 <= fVar39;
  auVar79._8_4_ = -(uint)bVar10;
  bVar9 = 3 < bVar5 && fVar86 <= fVar41;
  auVar79._12_4_ = -(uint)bVar9;
  iVar13 = movmskps(local_d8[0],auVar79);
  if (iVar13 != 0) {
    auVar62._0_4_ = fVar61 * (fVar26 - fVar77);
    auVar62._4_4_ = fVar71 * (fVar37 - fVar82);
    auVar62._8_4_ = fVar72 * (fVar39 - fVar84);
    auVar62._12_4_ = fVar73 * (fVar41 - fVar86);
    auVar89 = sqrtps(auVar88,auVar62);
    fVar39 = auVar89._0_4_;
    fVar72 = fVar95 - fVar39;
    fVar41 = auVar89._4_4_;
    fVar73 = fVar96 - fVar41;
    fVar61 = auVar89._8_4_;
    fVar77 = fVar97 - fVar61;
    fVar71 = auVar89._12_4_;
    fVar82 = fVar98 - fVar71;
    fVar95 = fVar95 + fVar39;
    fVar96 = fVar96 + fVar41;
    fVar97 = fVar97 + fVar61;
    fVar98 = fVar98 + fVar71;
    fVar26 = *(float *)(ray + k * 4 + 0x30);
    fVar37 = *(float *)(ray + k * 4 + 0x80);
    uVar99 = 0;
    uVar100 = 0;
    uVar101 = 0;
    uVar78 = -(uint)(fVar26 <= fVar72 && fVar72 <= fVar37);
    uVar83 = -(uint)(fVar26 <= fVar73 && fVar73 <= fVar37);
    uVar85 = -(uint)(fVar26 <= fVar77 && fVar77 <= fVar37);
    uVar87 = -(uint)(fVar26 <= fVar82 && fVar82 <= fVar37);
    uVar43 = uVar78 & auVar79._0_4_;
    uVar58 = uVar83 & auVar79._4_4_;
    auVar28._4_4_ = uVar58;
    auVar28._0_4_ = uVar43;
    uVar59 = uVar85 & auVar79._8_4_;
    uVar60 = uVar87 & auVar79._12_4_;
    auVar93._0_4_ = -(uint)((fVar26 <= fVar95 && fVar95 <= fVar37) && bVar11);
    auVar93._4_4_ = -(uint)((fVar26 <= fVar96 && fVar96 <= fVar37) && bVar12);
    auVar93._8_4_ = -(uint)((fVar26 <= fVar97 && fVar97 <= fVar37) && bVar10);
    auVar93._12_4_ = -(uint)((fVar26 <= fVar98 && fVar98 <= fVar37) && bVar9);
    auVar28._8_4_ = uVar59;
    auVar28._12_4_ = uVar60;
    local_248 = auVar28 | auVar93;
    iVar13 = movmskps(iVar13,local_248);
    if (iVar13 != 0) {
      local_1b8[0] = (float)((uint)fVar72 & uVar43 | ~uVar43 & (uint)fVar95);
      local_1b8[1] = (float)((uint)fVar73 & uVar58 | ~uVar58 & (uint)fVar96);
      fStack_1c0 = (float)((uint)fVar77 & uVar59 | ~uVar59 & (uint)fVar97);
      fStack_1bc = (float)((uint)fVar82 & uVar60 | ~uVar60 & (uint)fVar98);
      fVar26 = (float)(~uVar43 & (uint)fVar39 | (uint)-fVar39 & uVar43);
      fVar39 = (float)(~uVar58 & (uint)fVar41 | (uint)-fVar41 & uVar58);
      fVar41 = (float)(~uVar59 & (uint)fVar61 | (uint)-fVar61 & uVar59);
      fVar61 = (float)(~uVar60 & (uint)fVar71 | (uint)-fVar71 & uVar60);
      local_1b8[2] = fStack_1c0;
      local_1b8[3] = fStack_1bc;
      local_1a8[0] = fVar114 * fVar26 - fVar106;
      local_1a8[1] = fVar114 * fVar39 - fVar107;
      local_1a8[2] = fVar114 * fVar41 - fVar108;
      local_1a8[3] = fVar114 * fVar61 - fVar109;
      local_198[0] = fVar115 * fVar26 - fVar102;
      local_198[1] = fVar115 * fVar39 - fVar103;
      local_198[2] = fVar115 * fVar41 - fVar104;
      local_198[3] = fVar115 * fVar61 - fVar105;
      local_188[0] = fVar26 * fVar116 - fVar110;
      local_188[1] = fVar39 * fVar116 - fVar111;
      local_188[2] = fVar41 * fVar116 - fVar112;
      local_188[3] = fVar61 * fVar116 - fVar113;
      local_1c8 = (Scene *)CONCAT44(local_1b8[1],local_1b8[0]);
      uVar27 = local_248._0_4_;
      auVar44._0_4_ = (uint)local_1b8[0] & uVar27;
      uVar38 = local_248._4_4_;
      auVar44._4_4_ = (uint)local_1b8[1] & uVar38;
      uVar40 = local_248._8_4_;
      auVar44._8_4_ = (uint)fStack_1c0 & uVar40;
      uVar42 = local_248._12_4_;
      auVar44._12_4_ = (uint)fStack_1bc & uVar42;
      auVar63._0_8_ = CONCAT44(~uVar38,~uVar27) & 0x7f8000007f800000;
      auVar63._8_4_ = ~uVar40 & 0x7f800000;
      auVar63._12_4_ = ~uVar42 & 0x7f800000;
      auVar63 = auVar63 | auVar44;
      auVar74._4_4_ = auVar63._0_4_;
      auVar74._0_4_ = auVar63._4_4_;
      auVar74._8_4_ = auVar63._12_4_;
      auVar74._12_4_ = auVar63._8_4_;
      auVar79 = minps(auVar74,auVar63);
      auVar45._0_8_ = auVar79._8_8_;
      auVar45._8_4_ = auVar79._0_4_;
      auVar45._12_4_ = auVar79._4_4_;
      auVar79 = minps(auVar45,auVar79);
      uVar22 = -(uint)(auVar79._0_4_ == auVar63._0_4_);
      uVar23 = -(uint)(auVar79._4_4_ == auVar63._4_4_);
      uVar24 = -(uint)(auVar79._8_4_ == auVar63._8_4_);
      uVar25 = -(uint)(auVar79._12_4_ == auVar63._12_4_);
      auVar64._0_4_ = uVar22 & uVar27;
      auVar64._4_4_ = uVar23 & uVar38;
      auVar64._8_4_ = uVar24 & uVar40;
      auVar64._12_4_ = uVar25 & uVar42;
      iVar13 = movmskps(iVar13,auVar64);
      uVar43 = 0xffffffff;
      uVar58 = 0xffffffff;
      uVar59 = 0xffffffff;
      uVar60 = 0xffffffff;
      if (iVar13 != 0) {
        uVar43 = uVar22;
        uVar58 = uVar23;
        uVar59 = uVar24;
        uVar60 = uVar25;
      }
      auVar29._0_4_ = uVar27 & uVar43;
      auVar29._4_4_ = uVar38 & uVar58;
      auVar29._8_4_ = uVar40 & uVar59;
      auVar29._12_4_ = uVar42 & uVar60;
      uVar43 = movmskps(iVar13,auVar29);
      lVar19 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      pauVar20 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      fVar73 = fVar114;
      fVar77 = fVar114;
      fVar82 = fVar114;
      fVar61 = fVar115;
      fVar71 = fVar115;
      fVar72 = fVar115;
      fVar26 = fVar116;
      fVar39 = fVar116;
      fVar41 = fVar116;
      do {
        local_218.hit = (RTCHitN *)&local_c8;
        local_218.valid = (int *)local_238;
        local_68 = local_d8[lVar19];
        uVar16 = (ulong)local_68;
        pGVar6 = (pSVar21->geometries).items[uVar16].ptr;
        local_218.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_248 + lVar19 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar37 = local_1b8[lVar19];
            uVar99 = 0;
            uVar100 = 0;
            uVar101 = 0;
            *(float *)(ray + k * 4 + 0x80) = fVar37;
            *(float *)(ray + k * 4 + 0xc0) = local_1a8[lVar19];
            *(float *)(ray + k * 4 + 0xd0) = local_198[lVar19];
            *(float *)(ray + k * 4 + 0xe0) = local_188[lVar19];
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar19];
            *(uint *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar43 = context->user->instPrimID[0];
            uVar15 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar43;
LAB_00a0ab3c:
            local_248._0_4_ = uVar78 & -(uint)(fVar95 <= fVar37) & auVar93._0_4_;
            local_248._4_4_ = uVar83 & -(uint)(fVar96 <= fVar37) & auVar93._4_4_;
            local_248._8_4_ = uVar85 & -(uint)(fVar97 <= fVar37) & auVar93._8_4_;
            local_248._12_4_ = uVar87 & -(uint)(fVar98 <= fVar37) & auVar93._12_4_;
            iVar13 = movmskps(uVar43,local_248);
            if (iVar13 == 0) {
              return;
            }
            fVar84 = auVar89._0_4_;
            fVar86 = auVar89._4_4_;
            fVar91 = auVar89._8_4_;
            fVar92 = auVar89._12_4_;
            local_1b8[0] = fVar95;
            local_1b8[1] = fVar96;
            local_1b8[2] = fVar97;
            local_1b8[3] = fVar98;
            local_1a8[0] = fVar114 * fVar84 - fVar106;
            local_1a8[1] = fVar73 * fVar86 - fVar107;
            local_1a8[2] = fVar77 * fVar91 - fVar108;
            local_1a8[3] = fVar82 * fVar92 - fVar109;
            local_198[0] = fVar115 * fVar84 - fVar102;
            local_198[1] = fVar61 * fVar86 - fVar103;
            local_198[2] = fVar71 * fVar91 - fVar104;
            local_198[3] = fVar72 * fVar92 - fVar105;
            local_188[0] = fVar116 * fVar84 - fVar110;
            local_188[1] = fVar26 * fVar86 - fVar111;
            local_188[2] = fVar39 * fVar91 - fVar112;
            local_188[3] = fVar41 * fVar92 - fVar113;
            pSVar21 = context->scene;
            auVar32._0_4_ = (uint)fVar95 & local_248._0_4_;
            auVar32._4_4_ = (uint)fVar96 & local_248._4_4_;
            auVar32._8_4_ = (uint)fVar97 & local_248._8_4_;
            auVar32._12_4_ = (uint)fVar98 & local_248._12_4_;
            auVar51._0_8_ = CONCAT44(~local_248._4_4_,~local_248._0_4_) & 0x7f8000007f800000;
            auVar51._8_4_ = ~local_248._8_4_ & 0x7f800000;
            auVar51._12_4_ = ~local_248._12_4_ & 0x7f800000;
            auVar51 = auVar51 | auVar32;
            auVar66._4_4_ = auVar51._0_4_;
            auVar66._0_4_ = auVar51._4_4_;
            auVar66._8_4_ = auVar51._12_4_;
            auVar66._12_4_ = auVar51._8_4_;
            auVar89 = minps(auVar66,auVar51);
            auVar33._0_8_ = auVar89._8_8_;
            auVar33._8_4_ = auVar89._0_4_;
            auVar33._12_4_ = auVar89._4_4_;
            auVar89 = minps(auVar33,auVar89);
            auVar34._0_8_ =
                 CONCAT44(-(uint)(auVar89._4_4_ == auVar51._4_4_) & local_248._4_4_,
                          -(uint)(auVar89._0_4_ == auVar51._0_4_) & local_248._0_4_);
            auVar34._8_4_ = -(uint)(auVar89._8_4_ == auVar51._8_4_) & local_248._8_4_;
            auVar34._12_4_ = -(uint)(auVar89._12_4_ == auVar51._12_4_) & local_248._12_4_;
            iVar13 = movmskps(iVar13,auVar34);
            auVar80 = local_248;
            if (iVar13 != 0) {
              auVar80._8_4_ = auVar34._8_4_;
              auVar80._0_8_ = auVar34._0_8_;
              auVar80._12_4_ = auVar34._12_4_;
            }
            uVar14 = movmskps(iVar13,auVar80);
            lVar19 = 0;
            if (CONCAT44(uVar15,uVar14) != 0) {
              for (; (CONCAT44(uVar15,uVar14) >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            do {
              local_218.hit = (RTCHitN *)&local_c8;
              local_218.valid = (int *)local_238;
              local_68 = local_d8[lVar19];
              uVar16 = (ulong)local_68;
              pGVar6 = (pSVar21->geometries).items[uVar16].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_248 + lVar19 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar19];
                  *(float *)(ray + k * 4 + 0xc0) = local_1a8[lVar19];
                  *(float *)(ray + k * 4 + 0xd0) = local_198[lVar19];
                  *(float *)(ray + k * 4 + 0xe0) = local_188[lVar19];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar19];
                  *(uint *)(ray + k * 4 + 0x120) = local_68;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_78 = (sphere->primIDs).field_0.i[lVar19];
                local_c8 = local_1a8[lVar19];
                local_b8 = local_198[lVar19];
                fVar110 = local_188[lVar19];
                local_a8._4_4_ = fVar110;
                local_a8._0_4_ = fVar110;
                fStack_a0 = fVar110;
                fStack_9c = fVar110;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_88 = 0;
                uStack_80 = 0;
                local_98 = 0;
                uStack_90 = 0;
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                local_58 = context->user->instID[0];
                uStack_54 = local_58;
                uStack_50 = local_58;
                uStack_4c = local_58;
                local_48 = context->user->instPrimID[0];
                uStack_44 = local_48;
                uStack_40 = local_48;
                uStack_3c = local_48;
                *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar19];
                local_238 = *pauVar20;
                local_218.geometryUserPtr = pGVar6->userPtr;
                local_218.context = context->user;
                local_218.N = 4;
                p_Var17 = pGVar6->intersectionFilterN;
                local_218.ray = (RTCRayN *)ray;
                local_1e8 = fVar37;
                uStack_1e4 = uVar99;
                uStack_1e0 = uVar100;
                uStack_1dc = uVar101;
                local_1d8 = fVar95;
                fStack_1d4 = fVar96;
                fStack_1d0 = fVar97;
                fStack_1cc = fVar98;
                local_1c8 = pSVar21;
                if (p_Var17 != (RTCFilterFunctionN)0x0) {
                  local_220 = pauVar20;
                  p_Var17 = (RTCFilterFunctionN)(*p_Var17)(&local_218);
                  pauVar20 = local_220;
                }
                auVar52._0_4_ = -(uint)(local_238._0_4_ == 0);
                auVar52._4_4_ = -(uint)(local_238._4_4_ == 0);
                auVar52._8_4_ = -(uint)(local_238._8_4_ == 0);
                auVar52._12_4_ = -(uint)(local_238._12_4_ == 0);
                uVar78 = movmskps((int)p_Var17,auVar52);
                pRVar18 = (RayHitK<4> *)(ulong)(uVar78 ^ 0xf);
                if ((uVar78 ^ 0xf) == 0) {
                  auVar8._8_4_ = 0xffffffff;
                  auVar8._0_8_ = 0xffffffffffffffff;
                  auVar8._12_4_ = 0xffffffff;
                  auVar53 = auVar52 ^ auVar8;
                  pSVar21 = local_1c8;
                  fVar95 = local_1d8;
                  fVar96 = fStack_1d4;
                  fVar97 = fStack_1d0;
                  fVar98 = fStack_1cc;
                }
                else {
                  p_Var17 = context->args->filter;
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var17 = (RTCFilterFunctionN)(*p_Var17)(&local_218);
                  }
                  auVar35._0_4_ = -(uint)(local_238._0_4_ == 0);
                  auVar35._4_4_ = -(uint)(local_238._4_4_ == 0);
                  auVar35._8_4_ = -(uint)(local_238._8_4_ == 0);
                  auVar35._12_4_ = -(uint)(local_238._12_4_ == 0);
                  auVar53._8_4_ = 0xffffffff;
                  auVar53._0_8_ = 0xffffffffffffffff;
                  auVar53._12_4_ = 0xffffffff;
                  auVar53 = auVar35 ^ auVar53;
                  uVar78 = movmskps((int)p_Var17,auVar35);
                  pRVar18 = (RayHitK<4> *)(ulong)(uVar78 ^ 0xf);
                  pSVar21 = local_1c8;
                  fVar95 = local_1d8;
                  fVar96 = fStack_1d4;
                  fVar97 = fStack_1d0;
                  fVar98 = fStack_1cc;
                  if ((uVar78 ^ 0xf) != 0) {
                    auVar67._0_4_ = *(uint *)(local_218.ray + 0xc0) & auVar35._0_4_;
                    auVar67._4_4_ = *(uint *)(local_218.ray + 0xc4) & auVar35._4_4_;
                    auVar67._8_4_ = *(uint *)(local_218.ray + 200) & auVar35._8_4_;
                    auVar67._12_4_ = *(uint *)(local_218.ray + 0xcc) & auVar35._12_4_;
                    auVar94._0_4_ = ~auVar35._0_4_ & (uint)*(float *)local_218.hit;
                    auVar94._4_4_ = ~auVar35._4_4_ & (uint)*(float *)(local_218.hit + 4);
                    auVar94._8_4_ = ~auVar35._8_4_ & (uint)*(float *)(local_218.hit + 8);
                    auVar94._12_4_ = ~auVar35._12_4_ & (uint)*(float *)(local_218.hit + 0xc);
                    *(undefined1 (*) [16])(local_218.ray + 0xc0) = auVar94 | auVar67;
                    fVar110 = *(float *)(local_218.hit + 0x14);
                    fVar111 = *(float *)(local_218.hit + 0x18);
                    fVar113 = *(float *)(local_218.hit + 0x1c);
                    *(uint *)(local_218.ray + 0xd0) =
                         ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x10) |
                         *(uint *)(local_218.ray + 0xd0) & auVar35._0_4_;
                    *(uint *)(local_218.ray + 0xd4) =
                         ~auVar35._4_4_ & (uint)fVar110 |
                         *(uint *)(local_218.ray + 0xd4) & auVar35._4_4_;
                    *(uint *)(local_218.ray + 0xd8) =
                         ~auVar35._8_4_ & (uint)fVar111 |
                         *(uint *)(local_218.ray + 0xd8) & auVar35._8_4_;
                    *(uint *)(local_218.ray + 0xdc) =
                         ~auVar35._12_4_ & (uint)fVar113 |
                         *(uint *)(local_218.ray + 0xdc) & auVar35._12_4_;
                    auVar81._0_4_ = *(uint *)(local_218.ray + 0xe0) & auVar35._0_4_;
                    auVar81._4_4_ = *(uint *)(local_218.ray + 0xe4) & auVar35._4_4_;
                    auVar81._8_4_ = *(uint *)(local_218.ray + 0xe8) & auVar35._8_4_;
                    auVar81._12_4_ = *(uint *)(local_218.ray + 0xec) & auVar35._12_4_;
                    auVar68._0_4_ = ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x20);
                    auVar68._4_4_ = ~auVar35._4_4_ & (uint)*(float *)(local_218.hit + 0x24);
                    auVar68._8_4_ = ~auVar35._8_4_ & (uint)*(float *)(local_218.hit + 0x28);
                    auVar68._12_4_ = ~auVar35._12_4_ & (uint)*(float *)(local_218.hit + 0x2c);
                    *(undefined1 (*) [16])(local_218.ray + 0xe0) = auVar68 | auVar81;
                    auVar90._0_4_ = *(uint *)(local_218.ray + 0xf0) & auVar35._0_4_;
                    auVar90._4_4_ = *(uint *)(local_218.ray + 0xf4) & auVar35._4_4_;
                    auVar90._8_4_ = *(uint *)(local_218.ray + 0xf8) & auVar35._8_4_;
                    auVar90._12_4_ = *(uint *)(local_218.ray + 0xfc) & auVar35._12_4_;
                    auVar69._0_4_ = ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x30);
                    auVar69._4_4_ = ~auVar35._4_4_ & (uint)*(float *)(local_218.hit + 0x34);
                    auVar69._8_4_ = ~auVar35._8_4_ & (uint)*(float *)(local_218.hit + 0x38);
                    auVar69._12_4_ = ~auVar35._12_4_ & (uint)*(float *)(local_218.hit + 0x3c);
                    *(undefined1 (*) [16])(local_218.ray + 0xf0) = auVar69 | auVar90;
                    fVar110 = *(float *)(local_218.hit + 0x44);
                    fVar111 = *(float *)(local_218.hit + 0x48);
                    fVar113 = *(float *)(local_218.hit + 0x4c);
                    *(uint *)(local_218.ray + 0x100) =
                         ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x40) |
                         *(uint *)(local_218.ray + 0x100) & auVar35._0_4_;
                    *(uint *)(local_218.ray + 0x104) =
                         ~auVar35._4_4_ & (uint)fVar110 |
                         *(uint *)(local_218.ray + 0x104) & auVar35._4_4_;
                    *(uint *)(local_218.ray + 0x108) =
                         ~auVar35._8_4_ & (uint)fVar111 |
                         *(uint *)(local_218.ray + 0x108) & auVar35._8_4_;
                    *(uint *)(local_218.ray + 0x10c) =
                         ~auVar35._12_4_ & (uint)fVar113 |
                         *(uint *)(local_218.ray + 0x10c) & auVar35._12_4_;
                    fVar110 = *(float *)(local_218.hit + 0x54);
                    fVar111 = *(float *)(local_218.hit + 0x58);
                    fVar113 = *(float *)(local_218.hit + 0x5c);
                    *(uint *)(local_218.ray + 0x110) =
                         *(uint *)(local_218.ray + 0x110) & auVar35._0_4_ |
                         ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x50);
                    *(uint *)(local_218.ray + 0x114) =
                         *(uint *)(local_218.ray + 0x114) & auVar35._4_4_ |
                         ~auVar35._4_4_ & (uint)fVar110;
                    *(uint *)(local_218.ray + 0x118) =
                         *(uint *)(local_218.ray + 0x118) & auVar35._8_4_ |
                         ~auVar35._8_4_ & (uint)fVar111;
                    *(uint *)(local_218.ray + 0x11c) =
                         *(uint *)(local_218.ray + 0x11c) & auVar35._12_4_ |
                         ~auVar35._12_4_ & (uint)fVar113;
                    fVar110 = *(float *)(local_218.hit + 100);
                    fVar111 = *(float *)(local_218.hit + 0x68);
                    fVar113 = *(float *)(local_218.hit + 0x6c);
                    *(uint *)(local_218.ray + 0x120) =
                         *(uint *)(local_218.ray + 0x120) & auVar35._0_4_ |
                         ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x60);
                    *(uint *)(local_218.ray + 0x124) =
                         *(uint *)(local_218.ray + 0x124) & auVar35._4_4_ |
                         ~auVar35._4_4_ & (uint)fVar110;
                    *(uint *)(local_218.ray + 0x128) =
                         *(uint *)(local_218.ray + 0x128) & auVar35._8_4_ |
                         ~auVar35._8_4_ & (uint)fVar111;
                    *(uint *)(local_218.ray + 300) =
                         *(uint *)(local_218.ray + 300) & auVar35._12_4_ |
                         ~auVar35._12_4_ & (uint)fVar113;
                    fVar110 = *(float *)(local_218.hit + 0x74);
                    fVar111 = *(float *)(local_218.hit + 0x78);
                    fVar113 = *(float *)(local_218.hit + 0x7c);
                    *(uint *)(local_218.ray + 0x130) =
                         ~auVar35._0_4_ & (uint)*(float *)(local_218.hit + 0x70) |
                         *(uint *)(local_218.ray + 0x130) & auVar35._0_4_;
                    *(uint *)(local_218.ray + 0x134) =
                         ~auVar35._4_4_ & (uint)fVar110 |
                         *(uint *)(local_218.ray + 0x134) & auVar35._4_4_;
                    *(uint *)(local_218.ray + 0x138) =
                         ~auVar35._8_4_ & (uint)fVar111 |
                         *(uint *)(local_218.ray + 0x138) & auVar35._8_4_;
                    *(uint *)(local_218.ray + 0x13c) =
                         ~auVar35._12_4_ & (uint)fVar113 |
                         *(uint *)(local_218.ray + 0x13c) & auVar35._12_4_;
                    *(undefined1 (*) [16])(local_218.ray + 0x140) =
                         ~auVar35 & *(undefined1 (*) [16])(local_218.hit + 0x80) |
                         *(undefined1 (*) [16])(local_218.ray + 0x140) & auVar35;
                    pRVar18 = (RayHitK<4> *)local_218.ray;
                  }
                }
                auVar57._0_4_ = auVar53._0_4_ << 0x1f;
                auVar57._4_4_ = auVar53._4_4_ << 0x1f;
                auVar57._8_4_ = auVar53._8_4_ << 0x1f;
                auVar57._12_4_ = auVar53._12_4_ << 0x1f;
                iVar13 = movmskps((int)pRVar18,auVar57);
                uVar16 = CONCAT44((int)((ulong)pRVar18 >> 0x20),iVar13);
                if (iVar13 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = local_1e8;
                  fVar37 = local_1e8;
                  uVar99 = uStack_1e4;
                  uVar100 = uStack_1e0;
                  uVar101 = uStack_1dc;
                }
                else {
                  fVar37 = *(float *)(ray + k * 4 + 0x80);
                  uVar99 = 0;
                  uVar100 = 0;
                  uVar101 = 0;
                }
                *(undefined4 *)(local_248 + lVar19 * 4) = 0;
                local_248._0_4_ = -(uint)(fVar95 <= fVar37) & local_248._0_4_;
                local_248._4_4_ = -(uint)(fVar96 <= fVar37) & local_248._4_4_;
                local_248._8_4_ = -(uint)(fVar97 <= fVar37) & local_248._8_4_;
                local_248._12_4_ = -(uint)(fVar98 <= fVar37) & local_248._12_4_;
              }
              iVar13 = movmskps((int)uVar16,local_248);
              if (iVar13 == 0) {
                return;
              }
              uVar78 = local_248._0_4_;
              uVar83 = local_248._4_4_;
              uVar85 = local_248._8_4_;
              uVar87 = local_248._12_4_;
              auVar54._0_4_ = uVar78 & (uint)fVar95;
              auVar54._4_4_ = uVar83 & (uint)fVar96;
              auVar54._8_4_ = uVar85 & (uint)fVar97;
              auVar54._12_4_ = uVar87 & (uint)fVar98;
              auVar70._0_8_ = CONCAT44(~uVar83,~uVar78) & 0x7f8000007f800000;
              auVar70._8_4_ = ~uVar85 & 0x7f800000;
              auVar70._12_4_ = ~uVar87 & 0x7f800000;
              auVar70 = auVar70 | auVar54;
              auVar76._4_4_ = auVar70._0_4_;
              auVar76._0_4_ = auVar70._4_4_;
              auVar76._8_4_ = auVar70._12_4_;
              auVar76._12_4_ = auVar70._8_4_;
              auVar89 = minps(auVar76,auVar70);
              auVar55._0_8_ = auVar89._8_8_;
              auVar55._8_4_ = auVar89._0_4_;
              auVar55._12_4_ = auVar89._4_4_;
              auVar89 = minps(auVar55,auVar89);
              auVar56._0_8_ =
                   CONCAT44(-(uint)(auVar89._4_4_ == auVar70._4_4_) & uVar83,
                            -(uint)(auVar89._0_4_ == auVar70._0_4_) & uVar78);
              auVar56._8_4_ = -(uint)(auVar89._8_4_ == auVar70._8_4_) & uVar85;
              auVar56._12_4_ = -(uint)(auVar89._12_4_ == auVar70._12_4_) & uVar87;
              iVar13 = movmskps(iVar13,auVar56);
              auVar36 = local_248;
              if (iVar13 != 0) {
                auVar36._8_4_ = auVar56._8_4_;
                auVar36._0_8_ = auVar56._0_8_;
                auVar36._12_4_ = auVar56._12_4_;
              }
              uVar15 = movmskps(iVar13,auVar36);
              uVar16 = CONCAT44((int)(uVar16 >> 0x20),uVar15);
              lVar19 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
            } while( true );
          }
          local_168 = uVar78;
          uStack_164 = uVar83;
          uStack_160 = uVar85;
          uStack_15c = uVar87;
          local_78 = (sphere->primIDs).field_0.i[lVar19];
          local_c8 = local_1a8[lVar19];
          local_b8 = local_198[lVar19];
          local_a8._4_4_ = local_188[lVar19];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_a8._0_4_ = local_a8._4_4_;
          fStack_a0 = (float)local_a8._4_4_;
          fStack_9c = (float)local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = context->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = context->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar19];
          local_238 = *pauVar20;
          local_218.geometryUserPtr = pGVar6->userPtr;
          local_218.context = context->user;
          local_218.N = 4;
          p_Var17 = pGVar6->intersectionFilterN;
          local_e8 = fVar102;
          fStack_e4 = fVar103;
          fStack_e0 = fVar104;
          fStack_dc = fVar105;
          local_f8 = fVar106;
          fStack_f4 = fVar107;
          fStack_f0 = fVar108;
          fStack_ec = fVar109;
          local_108 = fVar110;
          fStack_104 = fVar111;
          fStack_100 = fVar112;
          fStack_fc = fVar113;
          local_170 = pSVar21;
          local_118 = fVar114;
          fStack_114 = fVar73;
          fStack_110 = fVar77;
          fStack_10c = fVar82;
          local_128 = fVar115;
          fStack_124 = fVar61;
          fStack_120 = fVar71;
          fStack_11c = fVar72;
          local_138 = fVar116;
          fStack_134 = fVar26;
          fStack_130 = fVar39;
          fStack_12c = fVar41;
          local_148 = auVar89;
          local_158 = auVar93;
          local_1e8 = fVar37;
          uStack_1e4 = uVar99;
          uStack_1e0 = uVar100;
          uStack_1dc = uVar101;
          local_1d8 = fVar95;
          fStack_1d4 = fVar96;
          fStack_1d0 = fVar97;
          fStack_1cc = fVar98;
          if (p_Var17 != (RTCFilterFunctionN)0x0) {
            local_220 = pauVar20;
            p_Var17 = (RTCFilterFunctionN)(*p_Var17)(&local_218);
            pauVar20 = local_220;
          }
          auVar46._0_4_ = -(uint)(local_238._0_4_ == 0);
          auVar46._4_4_ = -(uint)(local_238._4_4_ == 0);
          auVar46._8_4_ = -(uint)(local_238._8_4_ == 0);
          auVar46._12_4_ = -(uint)(local_238._12_4_ == 0);
          uVar78 = movmskps((int)p_Var17,auVar46);
          pRVar18 = (RayHitK<4> *)(ulong)(uVar78 ^ 0xf);
          if ((uVar78 ^ 0xf) == 0) {
            auVar46 = auVar46 ^ _DAT_01f7ae20;
            fVar95 = local_1d8;
            fVar96 = fStack_1d4;
            fVar97 = fStack_1d0;
            fVar98 = fStack_1cc;
          }
          else {
            p_Var17 = context->args->filter;
            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var17 = (RTCFilterFunctionN)(*p_Var17)(&local_218);
            }
            auVar30._0_4_ = -(uint)(local_238._0_4_ == 0);
            auVar30._4_4_ = -(uint)(local_238._4_4_ == 0);
            auVar30._8_4_ = -(uint)(local_238._8_4_ == 0);
            auVar30._12_4_ = -(uint)(local_238._12_4_ == 0);
            auVar46 = auVar30 ^ _DAT_01f7ae20;
            uVar78 = movmskps((int)p_Var17,auVar30);
            pRVar18 = (RayHitK<4> *)(ulong)(uVar78 ^ 0xf);
            fVar95 = local_1d8;
            fVar96 = fStack_1d4;
            fVar97 = fStack_1d0;
            fVar98 = fStack_1cc;
            if ((uVar78 ^ 0xf) != 0) {
              fVar110 = *(float *)(local_218.hit + 4);
              fVar111 = *(float *)(local_218.hit + 8);
              fVar113 = *(float *)(local_218.hit + 0xc);
              *(uint *)(local_218.ray + 0xc0) =
                   ~auVar30._0_4_ & (uint)*(float *)local_218.hit |
                   *(uint *)(local_218.ray + 0xc0) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0xc4) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0xc4) & auVar30._4_4_;
              *(uint *)(local_218.ray + 200) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 200) & auVar30._8_4_;
              *(uint *)(local_218.ray + 0xcc) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0xcc) & auVar30._12_4_;
              fVar110 = *(float *)(local_218.hit + 0x14);
              fVar111 = *(float *)(local_218.hit + 0x18);
              fVar113 = *(float *)(local_218.hit + 0x1c);
              *(uint *)(local_218.ray + 0xd0) =
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x10) |
                   *(uint *)(local_218.ray + 0xd0) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0xd4) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0xd4) & auVar30._4_4_;
              *(uint *)(local_218.ray + 0xd8) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 0xd8) & auVar30._8_4_;
              *(uint *)(local_218.ray + 0xdc) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0xdc) & auVar30._12_4_;
              fVar110 = *(float *)(local_218.hit + 0x24);
              fVar111 = *(float *)(local_218.hit + 0x28);
              fVar113 = *(float *)(local_218.hit + 0x2c);
              *(uint *)(local_218.ray + 0xe0) =
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x20) |
                   *(uint *)(local_218.ray + 0xe0) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0xe4) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0xe4) & auVar30._4_4_;
              *(uint *)(local_218.ray + 0xe8) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 0xe8) & auVar30._8_4_;
              *(uint *)(local_218.ray + 0xec) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0xec) & auVar30._12_4_;
              fVar110 = *(float *)(local_218.hit + 0x34);
              fVar111 = *(float *)(local_218.hit + 0x38);
              fVar113 = *(float *)(local_218.hit + 0x3c);
              *(uint *)(local_218.ray + 0xf0) =
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x30) |
                   *(uint *)(local_218.ray + 0xf0) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0xf4) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0xf4) & auVar30._4_4_;
              *(uint *)(local_218.ray + 0xf8) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 0xf8) & auVar30._8_4_;
              *(uint *)(local_218.ray + 0xfc) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0xfc) & auVar30._12_4_;
              fVar110 = *(float *)(local_218.hit + 0x44);
              fVar111 = *(float *)(local_218.hit + 0x48);
              fVar113 = *(float *)(local_218.hit + 0x4c);
              *(uint *)(local_218.ray + 0x100) =
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x40) |
                   *(uint *)(local_218.ray + 0x100) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0x104) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0x104) & auVar30._4_4_
              ;
              *(uint *)(local_218.ray + 0x108) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 0x108) & auVar30._8_4_
              ;
              *(uint *)(local_218.ray + 0x10c) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0x10c) & auVar30._12_4_;
              fVar110 = *(float *)(local_218.hit + 0x54);
              fVar111 = *(float *)(local_218.hit + 0x58);
              fVar113 = *(float *)(local_218.hit + 0x5c);
              *(uint *)(local_218.ray + 0x110) =
                   *(uint *)(local_218.ray + 0x110) & auVar30._0_4_ |
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x50);
              *(uint *)(local_218.ray + 0x114) =
                   *(uint *)(local_218.ray + 0x114) & auVar30._4_4_ | ~auVar30._4_4_ & (uint)fVar110
              ;
              *(uint *)(local_218.ray + 0x118) =
                   *(uint *)(local_218.ray + 0x118) & auVar30._8_4_ | ~auVar30._8_4_ & (uint)fVar111
              ;
              *(uint *)(local_218.ray + 0x11c) =
                   *(uint *)(local_218.ray + 0x11c) & auVar30._12_4_ |
                   ~auVar30._12_4_ & (uint)fVar113;
              fVar110 = *(float *)(local_218.hit + 100);
              fVar111 = *(float *)(local_218.hit + 0x68);
              fVar113 = *(float *)(local_218.hit + 0x6c);
              *(uint *)(local_218.ray + 0x120) =
                   *(uint *)(local_218.ray + 0x120) & auVar30._0_4_ |
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x60);
              *(uint *)(local_218.ray + 0x124) =
                   *(uint *)(local_218.ray + 0x124) & auVar30._4_4_ | ~auVar30._4_4_ & (uint)fVar110
              ;
              *(uint *)(local_218.ray + 0x128) =
                   *(uint *)(local_218.ray + 0x128) & auVar30._8_4_ | ~auVar30._8_4_ & (uint)fVar111
              ;
              *(uint *)(local_218.ray + 300) =
                   *(uint *)(local_218.ray + 300) & auVar30._12_4_ | ~auVar30._12_4_ & (uint)fVar113
              ;
              fVar110 = *(float *)(local_218.hit + 0x74);
              fVar111 = *(float *)(local_218.hit + 0x78);
              fVar113 = *(float *)(local_218.hit + 0x7c);
              *(uint *)(local_218.ray + 0x130) =
                   ~auVar30._0_4_ & (uint)*(float *)(local_218.hit + 0x70) |
                   *(uint *)(local_218.ray + 0x130) & auVar30._0_4_;
              *(uint *)(local_218.ray + 0x134) =
                   ~auVar30._4_4_ & (uint)fVar110 | *(uint *)(local_218.ray + 0x134) & auVar30._4_4_
              ;
              *(uint *)(local_218.ray + 0x138) =
                   ~auVar30._8_4_ & (uint)fVar111 | *(uint *)(local_218.ray + 0x138) & auVar30._8_4_
              ;
              *(uint *)(local_218.ray + 0x13c) =
                   ~auVar30._12_4_ & (uint)fVar113 |
                   *(uint *)(local_218.ray + 0x13c) & auVar30._12_4_;
              *(undefined1 (*) [16])(local_218.ray + 0x140) =
                   ~auVar30 & *(undefined1 (*) [16])(local_218.hit + 0x80) |
                   *(undefined1 (*) [16])(local_218.ray + 0x140) & auVar30;
              pRVar18 = (RayHitK<4> *)local_218.ray;
            }
          }
          fVar105 = fStack_dc;
          fVar104 = fStack_e0;
          fVar103 = fStack_e4;
          fVar102 = local_e8;
          fVar109 = fStack_ec;
          fVar108 = fStack_f0;
          fVar107 = fStack_f4;
          fVar106 = local_f8;
          fVar113 = fStack_fc;
          fVar112 = fStack_100;
          fVar111 = fStack_104;
          fVar110 = local_108;
          fVar82 = fStack_10c;
          fVar77 = fStack_110;
          fVar73 = fStack_114;
          fVar114 = local_118;
          fVar72 = fStack_11c;
          fVar71 = fStack_120;
          fVar61 = fStack_124;
          fVar115 = local_128;
          fVar41 = fStack_12c;
          fVar39 = fStack_130;
          fVar26 = fStack_134;
          fVar116 = local_138;
          auVar89 = local_148;
          auVar93 = local_158;
          uVar87 = uStack_15c;
          uVar85 = uStack_160;
          uVar83 = uStack_164;
          uVar78 = local_168;
          pSVar21 = local_170;
          auVar50._0_4_ = auVar46._0_4_ << 0x1f;
          auVar50._4_4_ = auVar46._4_4_ << 0x1f;
          auVar50._8_4_ = auVar46._8_4_ << 0x1f;
          auVar50._12_4_ = auVar46._12_4_ << 0x1f;
          iVar13 = movmskps((int)pRVar18,auVar50);
          uVar16 = CONCAT44((int)((ulong)pRVar18 >> 0x20),iVar13);
          if (iVar13 == 0) {
            *(float *)(ray + k * 4 + 0x80) = local_1e8;
            fVar37 = local_1e8;
            uVar99 = uStack_1e4;
            uVar100 = uStack_1e0;
            uVar101 = uStack_1dc;
          }
          else {
            fVar37 = *(float *)(ray + k * 4 + 0x80);
            uVar99 = 0;
            uVar100 = 0;
            uVar101 = 0;
          }
          *(undefined4 *)(local_248 + lVar19 * 4) = 0;
          local_248._0_4_ = -(uint)((float)local_1c8 <= fVar37) & local_248._0_4_;
          local_248._4_4_ = -(uint)(local_1c8._4_4_ <= fVar37) & local_248._4_4_;
          local_248._8_4_ = -(uint)(fStack_1c0 <= fVar37) & local_248._8_4_;
          local_248._12_4_ = -(uint)(fStack_1bc <= fVar37) & local_248._12_4_;
        }
        uVar15 = (undefined4)(uVar16 >> 0x20);
        uVar43 = movmskps((int)uVar16,local_248);
        if (uVar43 == 0) goto LAB_00a0ab3c;
        uVar58 = local_248._0_4_;
        uVar59 = local_248._4_4_;
        uVar60 = local_248._8_4_;
        uVar22 = local_248._12_4_;
        auVar47._0_4_ = uVar58 & (uint)(float)local_1c8;
        auVar47._4_4_ = uVar59 & (uint)local_1c8._4_4_;
        auVar47._8_4_ = uVar60 & (uint)fStack_1c0;
        auVar47._12_4_ = uVar22 & (uint)fStack_1bc;
        auVar65._0_8_ = CONCAT44(~uVar59,~uVar58) & 0x7f8000007f800000;
        auVar65._8_4_ = ~uVar60 & 0x7f800000;
        auVar65._12_4_ = ~uVar22 & 0x7f800000;
        auVar65 = auVar65 | auVar47;
        auVar75._4_4_ = auVar65._0_4_;
        auVar75._0_4_ = auVar65._4_4_;
        auVar75._8_4_ = auVar65._12_4_;
        auVar75._12_4_ = auVar65._8_4_;
        auVar79 = minps(auVar75,auVar65);
        auVar48._0_8_ = auVar79._8_8_;
        auVar48._8_4_ = auVar79._0_4_;
        auVar48._12_4_ = auVar79._4_4_;
        auVar79 = minps(auVar48,auVar79);
        auVar49._0_8_ =
             CONCAT44(-(uint)(auVar79._4_4_ == auVar65._4_4_) & uVar59,
                      -(uint)(auVar79._0_4_ == auVar65._0_4_) & uVar58);
        auVar49._8_4_ = -(uint)(auVar79._8_4_ == auVar65._8_4_) & uVar60;
        auVar49._12_4_ = -(uint)(auVar79._12_4_ == auVar65._12_4_) & uVar22;
        iVar13 = movmskps(uVar43,auVar49);
        auVar31 = local_248;
        if (iVar13 != 0) {
          auVar31._8_4_ = auVar49._8_4_;
          auVar31._0_8_ = auVar49._0_8_;
          auVar31._12_4_ = auVar49._12_4_;
        }
        uVar14 = movmskps(iVar13,auVar31);
        lVar19 = 0;
        if (CONCAT44(uVar15,uVar14) != 0) {
          for (; (CONCAT44(uVar15,uVar14) >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }